

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_module.cpp
# Opt level: O0

Id __thiscall
dxil_spv::SPIRVModule::Impl::build_wave_match(Impl *this,SPIRVModule *module,Id type_id)

{
  initializer_list<unsigned_int> __l;
  bool bVar1;
  Id IVar2;
  Id IVar3;
  Op OVar4;
  Function *this_00;
  Block *this_01;
  Block *this_02;
  Block *this_03;
  __uniq_ptr_data<spv::Instruction,_std::default_delete<spv::Instruction>,_true,_true> this_04;
  pointer pIVar5;
  pointer pIVar6;
  size_t sVar7;
  Block *size;
  Id local_174;
  unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> local_170;
  undefined4 local_168;
  Id local_164;
  unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> local_160;
  __single_object phi;
  unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> local_150;
  unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> local_148;
  Id local_13c;
  undefined4 local_138;
  Id ballot_id;
  unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> local_130;
  __single_object ballot;
  Op local_120;
  Id compare_id;
  unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> local_118;
  __single_object compare;
  Op equal_op;
  unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> local_100;
  __single_object broadcast_first;
  Block *inner_header_block;
  Block *pBStack_e8;
  Id undef_id;
  Block *return_block;
  Block *outer_header;
  Block *merge_block;
  Block *body_block;
  Block *header_block;
  undefined1 local_b8 [4];
  Id value_id;
  Function *local_a0;
  Function *func;
  iterator local_90;
  undefined8 local_88;
  undefined1 local_80 [8];
  Vector<spv::Id> types;
  Op local_60;
  Id bool_type;
  Id uvec4_type;
  Id uint_type;
  Block *entry;
  Block *current_build_point;
  pair<unsigned_int,_unsigned_int> *type;
  iterator __end1;
  iterator __begin1;
  Vector<std::pair<spv::Id,_spv::Id>_> *__range1;
  SPIRVModule *pSStack_20;
  Id type_id_local;
  SPIRVModule *module_local;
  Impl *this_local;
  
  __range1._4_4_ = type_id;
  pSStack_20 = module;
  module_local = (SPIRVModule *)this;
  __end1 = std::
           vector<std::pair<unsigned_int,_unsigned_int>,_dxil_spv::ThreadLocalAllocator<std::pair<unsigned_int,_unsigned_int>_>_>
           ::begin(&this->wave_match_call_ids);
  type = (pair<unsigned_int,_unsigned_int> *)
         std::
         vector<std::pair<unsigned_int,_unsigned_int>,_dxil_spv::ThreadLocalAllocator<std::pair<unsigned_int,_unsigned_int>_>_>
         ::end(&this->wave_match_call_ids);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<std::pair<unsigned_int,_unsigned_int>_*,_std::vector<std::pair<unsigned_int,_unsigned_int>,_dxil_spv::ThreadLocalAllocator<std::pair<unsigned_int,_unsigned_int>_>_>_>
                                     *)&type), bVar1) {
    current_build_point =
         (Block *)__gnu_cxx::
                  __normal_iterator<std::pair<unsigned_int,_unsigned_int>_*,_std::vector<std::pair<unsigned_int,_unsigned_int>,_dxil_spv::ThreadLocalAllocator<std::pair<unsigned_int,_unsigned_int>_>_>_>
                  ::operator*(&__end1);
    if (*(uint *)&current_build_point->_vptr_Block == __range1._4_4_) {
      return *(uint *)((long)&current_build_point->_vptr_Block + 4);
    }
    __gnu_cxx::
    __normal_iterator<std::pair<unsigned_int,_unsigned_int>_*,_std::vector<std::pair<unsigned_int,_unsigned_int>,_dxil_spv::ThreadLocalAllocator<std::pair<unsigned_int,_unsigned_int>_>_>_>
    ::operator++(&__end1);
  }
  entry = spv::Builder::getBuildPoint(&this->builder);
  spv::Builder::addCapability(&this->builder,CapabilityGroupNonUniform);
  spv::Builder::addCapability(&this->builder,CapabilityGroupNonUniformBallot);
  _uvec4_type = (Block *)0x0;
  bool_type = spv::Builder::makeUintType(&this->builder,0x20);
  local_60 = spv::Builder::makeVectorType(&this->builder,bool_type,4);
  types.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = spv::Builder::makeBoolType(&this->builder);
  func._4_4_ = __range1._4_4_;
  local_90 = (iterator)((long)&func + 4);
  local_88 = 1;
  __l._M_len = 1;
  __l._M_array = local_90;
  std::vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_> *)local_80,__l,
             (allocator_type *)((long)&func + 3));
  if ((this->helper_lanes_participate_in_wave_ops & 1U) == 0) {
    std::vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::push_back
              ((vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_> *)local_80,
               (value_type_conflict1 *)
               ((long)&types.
                       super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 4));
  }
  OVar4 = local_60;
  memset(local_b8,0,0x18);
  std::
  vector<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
  ::vector((vector<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
            *)local_b8);
  this_00 = spv::Builder::makeFunctionEntry
                      (&this->builder,DecorationMax,OVar4,"WaveMatch",(Vector<Id> *)local_80,
                       (Vector<dxil_spv::Vector<Decoration>_> *)local_b8,(Block **)&uvec4_type);
  std::
  vector<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
  ::~vector((vector<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
             *)local_b8);
  sVar7 = 0;
  local_a0 = this_00;
  IVar2 = spv::Function::getParamId(this_00,0);
  this_01 = (Block *)spv::Block::operator_new((Block *)0x78,sVar7);
  IVar3 = spv::Builder::getUniqueId(&this->builder);
  sVar7 = (size_t)IVar3;
  spv::Block::Block(this_01,IVar3,local_a0);
  this_02 = (Block *)spv::Block::operator_new((Block *)0x78,sVar7);
  IVar3 = spv::Builder::getUniqueId(&this->builder);
  sVar7 = (size_t)IVar3;
  spv::Block::Block(this_02,IVar3,local_a0);
  this_03 = (Block *)spv::Block::operator_new((Block *)0x78,sVar7);
  IVar3 = spv::Builder::getUniqueId(&this->builder);
  spv::Block::Block(this_03,IVar3,local_a0);
  return_block = (Block *)0x0;
  pBStack_e8 = (Block *)0x0;
  inner_header_block._4_4_ = 0;
  spv::Builder::setBuildPoint(&this->builder,_uvec4_type);
  spv::Builder::createBranch(&this->builder,this_01);
  size = this_01;
  spv::Builder::setBuildPoint(&this->builder,this_01);
  body_block = this_01;
  if ((this->helper_lanes_participate_in_wave_ops & 1U) == 0) {
    pBStack_e8 = (Block *)spv::Block::operator_new((Block *)0x78,(size_t)size);
    IVar3 = spv::Builder::getUniqueId(&this->builder);
    sVar7 = (size_t)IVar3;
    spv::Block::Block(pBStack_e8,IVar3,local_a0);
    this_04.super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>._M_t.
    super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
    super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl =
         (__uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>)
         spv::Block::operator_new((Block *)0x78,sVar7);
    IVar3 = spv::Builder::getUniqueId(&this->builder);
    spv::Block::Block((Block *)this_04.
                               super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                               .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl,IVar3,
                      local_a0);
    broadcast_first._M_t.
    super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>._M_t.
    super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
    super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl =
         (__uniq_ptr_data<spv::Instruction,_std::default_delete<spv::Instruction>,_true,_true>)
         (__uniq_ptr_data<spv::Instruction,_std::default_delete<spv::Instruction>,_true,_true>)
         this_04.super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>.
         _M_t.super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
         super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl;
    inner_header_block._4_4_ = spv::Builder::createUndefined(&this->builder,local_60);
    spv::Builder::createSelectionMerge(&this->builder,pBStack_e8,0);
    IVar3 = spv::Function::getParamId(local_a0,1);
    spv::Builder::createConditionalBranch
              (&this->builder,IVar3,pBStack_e8,
               (Block *)broadcast_first._M_t.
                        super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                        .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl);
    body_block = (Block *)broadcast_first._M_t.
                          super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                          .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl;
    spv::Builder::setBuildPoint
              (&this->builder,
               (Block *)broadcast_first._M_t.
                        super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                        .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl);
    return_block = this_01;
  }
  spv::Builder::createLoopMerge(&this->builder,this_03,this_02,0);
  spv::Builder::createBranch(&this->builder,this_02);
  equal_op = spv::Builder::getUniqueId(&this->builder);
  std::make_unique<spv::Instruction,unsigned_int,unsigned_int&,spv::Op>
            ((uint *)&local_100,&equal_op,(Op *)((long)&__range1 + 4));
  pIVar5 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::operator->
                     (&local_100);
  IVar3 = spv::Builder::makeUintConstant(&this->builder,3,false);
  spv::Instruction::addIdOperand(pIVar5,IVar3);
  pIVar5 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::operator->
                     (&local_100);
  spv::Instruction::addIdOperand(pIVar5,IVar2);
  OVar4 = spv::Builder::getTypeClass(&this->builder,__range1._4_4_);
  if (OVar4 != OpTypeFloat) {
    OVar4 = spv::Builder::getTypeClass(&this->builder,__range1._4_4_);
    if (OVar4 == OpTypeBool) {
      compare._M_t.super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>.
      _M_t.super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
      super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl._4_4_ = 0xa4;
    }
    else {
      compare._M_t.super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>.
      _M_t.super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
      super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl._4_4_ = 0xaa;
    }
    compare_id = spv::Builder::getUniqueId(&this->builder);
    local_120 = spv::Builder::makeBoolType(&this->builder);
    std::make_unique<spv::Instruction,unsigned_int,unsigned_int,spv::Op&>
              ((uint *)&local_118,&compare_id,&local_120);
    pIVar5 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::operator->
                       (&local_118);
    spv::Instruction::addIdOperand(pIVar5,IVar2);
    pIVar5 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::operator->
                       (&local_118);
    pIVar6 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::operator->
                       (&local_100);
    IVar2 = spv::Instruction::getResultId(pIVar6);
    spv::Instruction::addIdOperand(pIVar5,IVar2);
    pIVar5 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::operator->
                       (&local_118);
    ballot._M_t.super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>._M_t
    .super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
    super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl._4_4_ =
         spv::Instruction::getResultId(pIVar5);
    ballot_id = spv::Builder::getUniqueId(&this->builder);
    local_138 = 0x153;
    std::make_unique<spv::Instruction,unsigned_int,unsigned_int&,spv::Op>
              ((uint *)&local_130,&ballot_id,&local_60);
    pIVar5 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::operator->
                       (&local_130);
    IVar2 = spv::Builder::makeUintConstant(&this->builder,3,false);
    spv::Instruction::addIdOperand(pIVar5,IVar2);
    pIVar5 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::operator->
                       (&local_130);
    pIVar6 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::operator->
                       (&local_118);
    IVar2 = spv::Instruction::getResultId(pIVar6);
    spv::Instruction::addIdOperand(pIVar5,IVar2);
    pIVar5 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::operator->
                       (&local_130);
    local_13c = spv::Instruction::getResultId(pIVar5);
    spv::Builder::setBuildPoint(&this->builder,this_02);
    std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::unique_ptr
              (&local_148,&local_100);
    add_instruction(this,this_02,&local_148);
    std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::~unique_ptr
              (&local_148);
    std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::unique_ptr
              (&local_150,&local_118);
    add_instruction(this,this_02,&local_150);
    std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::~unique_ptr
              (&local_150);
    std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::unique_ptr
              (&phi,&local_130);
    add_instruction(this,this_02,&phi);
    std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::~unique_ptr(&phi);
    spv::Builder::createConditionalBranch
              (&this->builder,
               ballot._M_t.
               super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>._M_t.
               super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
               super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl._4_4_,this_03,
               body_block);
    spv::Builder::setBuildPoint(&this->builder,this_03);
    if (pBStack_e8 != (Block *)0x0) {
      spv::Builder::createBranch(&this->builder,pBStack_e8);
      spv::Builder::setBuildPoint(&this->builder,pBStack_e8);
      local_164 = spv::Builder::getUniqueId(&this->builder);
      local_168 = 0xf5;
      std::make_unique<spv::Instruction,unsigned_int,unsigned_int&,spv::Op>
                ((uint *)&local_160,&local_164,&local_60);
      pIVar5 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::operator->
                         (&local_160);
      spv::Instruction::addIdOperand(pIVar5,local_13c);
      pIVar5 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::operator->
                         (&local_160);
      IVar2 = spv::Block::getId(this_03);
      spv::Instruction::addIdOperand(pIVar5,IVar2);
      pIVar5 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::operator->
                         (&local_160);
      spv::Instruction::addIdOperand(pIVar5,inner_header_block._4_4_);
      pIVar5 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::operator->
                         (&local_160);
      IVar2 = spv::Block::getId(return_block);
      spv::Instruction::addIdOperand(pIVar5,IVar2);
      pIVar5 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::operator->
                         (&local_160);
      local_13c = spv::Instruction::getResultId(pIVar5);
      std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::unique_ptr
                (&local_170,&local_160);
      add_instruction(this,pBStack_e8,&local_170);
      std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::~unique_ptr
                (&local_170);
      std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::~unique_ptr
                (&local_160);
    }
    spv::Builder::makeReturn(&this->builder,false,local_13c);
    spv::Builder::setBuildPoint(&this->builder,entry);
    local_174 = spv::Function::getId(local_a0);
    std::
    vector<std::pair<unsigned_int,unsigned_int>,dxil_spv::ThreadLocalAllocator<std::pair<unsigned_int,unsigned_int>>>
    ::emplace_back<unsigned_int&,unsigned_int>
              ((vector<std::pair<unsigned_int,unsigned_int>,dxil_spv::ThreadLocalAllocator<std::pair<unsigned_int,unsigned_int>>>
                *)&this->wave_match_call_ids,(uint *)((long)&__range1 + 4),&local_174);
    this_local._4_4_ = spv::Function::getId(local_a0);
    std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::~unique_ptr
              (&local_130);
    std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::~unique_ptr
              (&local_118);
    std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::~unique_ptr
              (&local_100);
    std::vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::~vector
              ((vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_> *)local_80);
    return this_local._4_4_;
  }
  __assert_fail("builder.getTypeClass(type_id) != spv::OpTypeFloat",
                "/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/spirv_module.cpp"
                ,0x423,
                "spv::Id dxil_spv::SPIRVModule::Impl::build_wave_match(SPIRVModule &, spv::Id)");
}

Assistant:

spv::Id SPIRVModule::Impl::build_wave_match(SPIRVModule &module, spv::Id type_id)
{
	for (auto &type : wave_match_call_ids)
		if (type.first == type_id)
			return type.second;

	auto *current_build_point = builder.getBuildPoint();
	builder.addCapability(spv::CapabilityGroupNonUniform);
	builder.addCapability(spv::CapabilityGroupNonUniformBallot);

	spv::Block *entry = nullptr;
	spv::Id uint_type = builder.makeUintType(32);
	spv::Id uvec4_type = builder.makeVectorType(uint_type, 4);
	spv::Id bool_type = builder.makeBoolType();
	Vector<spv::Id> types = { type_id };
	if (!helper_lanes_participate_in_wave_ops)
		types.push_back(bool_type);
	auto *func = builder.makeFunctionEntry(spv::NoPrecision, uvec4_type,
	                                       "WaveMatch",
	                                       types, {}, &entry);
	spv::Id value_id = func->getParamId(0);

	auto *header_block = new spv::Block(builder.getUniqueId(), *func);
	auto *body_block = new spv::Block(builder.getUniqueId(), *func);
	auto *merge_block = new spv::Block(builder.getUniqueId(), *func);
	spv::Block *outer_header = nullptr;
	spv::Block *return_block = nullptr;
	spv::Id undef_id = 0;

	builder.setBuildPoint(entry);
	builder.createBranch(header_block);
	builder.setBuildPoint(header_block);

	if (!helper_lanes_participate_in_wave_ops)
	{
		return_block = new spv::Block(builder.getUniqueId(), *func);
		auto *inner_header_block = new spv::Block(builder.getUniqueId(), *func);
		undef_id = builder.createUndefined(uvec4_type);
		builder.createSelectionMerge(return_block, 0);
		builder.createConditionalBranch(func->getParamId(1), return_block, inner_header_block);
		outer_header = header_block;
		header_block = inner_header_block;
		builder.setBuildPoint(header_block);
	}

	builder.createLoopMerge(merge_block, body_block, 0);
	builder.createBranch(body_block);

	auto broadcast_first = std::make_unique<spv::Instruction>(builder.getUniqueId(), type_id, spv::OpGroupNonUniformBroadcastFirst);
	broadcast_first->addIdOperand(builder.makeUintConstant(spv::ScopeSubgroup));
	broadcast_first->addIdOperand(value_id);

	// We cannot scalarize floats safely due to NaNs. Caller will bitcast to uint first.
	assert(builder.getTypeClass(type_id) != spv::OpTypeFloat);
	spv::Op equal_op;
	if (builder.getTypeClass(type_id) == spv::OpTypeBool)
		equal_op = spv::OpLogicalEqual;
	else
		equal_op = spv::OpIEqual;

	auto compare = std::make_unique<spv::Instruction>(builder.getUniqueId(), builder.makeBoolType(), equal_op);
	compare->addIdOperand(value_id);
	compare->addIdOperand(broadcast_first->getResultId());
	spv::Id compare_id = compare->getResultId();

	auto ballot = std::make_unique<spv::Instruction>(builder.getUniqueId(), uvec4_type, spv::OpGroupNonUniformBallot);
	ballot->addIdOperand(builder.makeUintConstant(spv::ScopeSubgroup));
	ballot->addIdOperand(compare->getResultId());
	spv::Id ballot_id = ballot->getResultId();

	builder.setBuildPoint(body_block);
	add_instruction(body_block, std::move(broadcast_first));
	add_instruction(body_block, std::move(compare));
	add_instruction(body_block, std::move(ballot));
	builder.createConditionalBranch(compare_id, merge_block, header_block);

	builder.setBuildPoint(merge_block);

	if (return_block)
	{
		builder.createBranch(return_block);
		builder.setBuildPoint(return_block);

		auto phi = std::make_unique<spv::Instruction>(builder.getUniqueId(), uvec4_type, spv::OpPhi);
		phi->addIdOperand(ballot_id);
		phi->addIdOperand(merge_block->getId());
		phi->addIdOperand(undef_id);
		phi->addIdOperand(outer_header->getId());
		ballot_id = phi->getResultId();
		add_instruction(return_block, std::move(phi));
	}

	builder.makeReturn(false, ballot_id);
	builder.setBuildPoint(current_build_point);

	wave_match_call_ids.emplace_back(type_id, func->getId());
	return func->getId();
}